

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::json_abi_v3_11_2::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
::patch_inplace(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *json_patch)

{
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  int iVar4;
  reference pbVar5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar6;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar7;
  parse_error *ppVar8;
  other_error *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char (*in_R8) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> from_path;
  json_pointer from_ptr;
  anon_class_8_1_ba1d8281 get_value;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op;
  anon_class_8_1_6971b95b operation_add;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  const_iterator __begin0;
  json_pointer ptr;
  anon_class_16_2_51289818 operation_remove;
  const_iterator __end0;
  string local_198;
  string local_178;
  reference local_158;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_150;
  string local_148;
  string local_128;
  anon_class_8_1_6971b95b local_108;
  string local_100;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  string local_d0;
  reference local_b0;
  json_pointer local_a8;
  anon_class_16_2_51289818 local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  local_150 = this;
  local_108.result = this;
  local_90.this = this;
  local_90.result = this;
  if (json_patch->m_type != array) {
    ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"JSON patch must be an array of objects","");
    detail::parse_error::
    create<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_0>
              (ppVar8,0x68,0,&local_d0,json_patch);
    __cxa_throw(ppVar8,&detail::parse_error::typeinfo,detail::exception::~exception);
  }
  local_d0._M_string_length = 0;
  local_d0.field_2._8_8_ = -0x8000000000000000;
  local_d0.field_2._M_allocated_capacity =
       (size_type)
       (((json_patch->m_value).array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_50.m_it.array_iterator._M_current =
       (((json_patch->m_value).array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_d0._M_dataplus._M_p = (pointer)json_patch;
  local_50.m_object = json_patch;
  bVar3 = detail::
          iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&local_d0,&local_50);
  if (!bVar3) {
    do {
      pbVar5 = detail::
               iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&local_d0);
      local_158 = pbVar5;
      if (pbVar5->m_type != object) {
        ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"JSON patch must be an array of objects","");
        detail::parse_error::
        create<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_0>
                  (ppVar8,0x68,0,&local_128,pbVar5);
        __cxa_throw(ppVar8,&detail::parse_error::typeinfo,detail::exception::~exception);
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_b0 = pbVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"op","");
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"op","");
      pbVar6 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::
               patch_inplace(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
               ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)#1}::
               operator()::string_const__bool__const(&local_158,&local_100,&local_198,true);
      get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_128,pbVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"path","");
      pbVar6 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::
               patch_inplace(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
               ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)#1}::
               operator()::string_const__bool__const(&local_158,&local_128,&local_198,true);
      get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_100,pbVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::split(&local_a8.reference_tokens,&local_100);
      iVar4 = std::__cxx11::string::compare((char *)&local_128);
      if (iVar4 == 0) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"add","");
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"value","");
        pbVar6 = &local_60;
        pbVar7 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::
                 patch_inplace(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
                 ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)#1}::
                 operator()::string_const__bool__const(&local_158,&local_198,&local_178,false);
        basic_json(pbVar6,pbVar7);
        patch_inplace::anon_class_8_1_6971b95b::operator()(&local_108,&local_a8,pbVar6);
LAB_00111bff:
        ~basic_json(pbVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
LAB_00111e24:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_128);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)&local_128);
          if (iVar4 == 0) {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"replace","");
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"value","");
            pbVar6 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::
                     patch_inplace(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
                     ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)#1}::
                     operator()::string_const__bool__const(&local_158,&local_198,&local_178,false);
            basic_json(&local_e0,pbVar6);
            pbVar6 = json_pointer<std::__cxx11::string>::
                     get_checked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                               ((json_pointer<std::__cxx11::string> *)&local_a8,local_150);
            vVar1 = pbVar6->m_type;
            pbVar6->m_type = local_e0.m_type;
            jVar2 = pbVar6->m_value;
            pbVar6->m_value = local_e0.m_value;
            pbVar6 = &local_e0;
            local_e0.m_type = vVar1;
            local_e0.m_value = jVar2;
            goto LAB_00111bff;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_128);
          if (iVar4 == 0) {
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"move","");
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"from","");
            pbVar6 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::
                     patch_inplace(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
                     ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)#1}::
                     operator()::string_const__bool__const(&local_158,&local_178,&local_148,true);
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_198,pbVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_178,&local_198);
            pbVar6 = json_pointer<std::__cxx11::string>::
                     get_checked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                               ((json_pointer<std::__cxx11::string> *)&local_178,local_150);
            basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_148,pbVar6);
            patch_inplace::anon_class_16_2_51289818::operator()
                      (&local_90,(json_pointer *)&local_178);
            pbVar6 = &local_70;
            basic_json(pbVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_148);
            patch_inplace::anon_class_8_1_6971b95b::operator()(&local_108,&local_a8,pbVar6);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_128);
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::string::compare((char *)&local_128);
              if (iVar4 != 0) {
                ppVar8 = (parse_error *)__cxa_allocate_exception(0x28);
                detail::
                concat<std::__cxx11::string,char_const(&)[18],std::__cxx11::string_const&,char_const(&)[13]>
                          (&local_198,(detail *)"operation value \'",(char (*) [18])&local_128,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "\' is invalid",in_R8);
                detail::parse_error::
                create<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_0>
                          (ppVar8,0x69,0,&local_198,local_b0);
                __cxa_throw(ppVar8,&detail::parse_error::typeinfo,detail::exception::~exception);
              }
              pbVar6 = json_pointer<std::__cxx11::string>::
                       get_checked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                 ((json_pointer<std::__cxx11::string> *)&local_a8,local_150);
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"test","");
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"value","");
              pbVar7 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::
                       patch_inplace(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
                       ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)#1}::
                       operator()::string_const__bool__const(&local_158,&local_198,&local_178,false)
              ;
              bVar3 = operator==(pbVar6,pbVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p,
                                local_178.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
              if (!bVar3) {
                __return_storage_ptr__ = (other_error *)__cxa_allocate_exception(0x20);
                pbVar5 = local_b0;
                args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
                dump(&local_178,local_b0,-1,' ',false,strict);
                detail::concat<std::__cxx11::string,char_const(&)[15],std::__cxx11::string>
                          (&local_198,(detail *)"unsuccessful: ",(char (*) [15])&local_178,args_1);
                detail::other_error::
                create<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_0>
                          (__return_storage_ptr__,0x1f5,&local_198,pbVar5);
                __cxa_throw(__return_storage_ptr__,&detail::other_error::typeinfo,
                            detail::exception::~exception);
              }
              goto LAB_00111e3f;
            }
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"copy","");
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"from","");
            pbVar6 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::
                     patch_inplace(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)
                     ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)#1}::
                     operator()::string_const__bool__const(&local_158,&local_178,&local_148,true);
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_198,pbVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_178,&local_198);
            pbVar6 = json_pointer<std::__cxx11::string>::
                     get_checked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                               ((json_pointer<std::__cxx11::string> *)&local_178,local_150);
            basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_148,pbVar6);
            pbVar6 = &local_80;
            basic_json(pbVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_148);
            patch_inplace::anon_class_8_1_6971b95b::operator()(&local_108,&local_a8,pbVar6);
          }
          ~basic_json(pbVar6);
          ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_148);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_178);
          goto LAB_00111e24;
        }
        patch_inplace::anon_class_16_2_51289818::operator()(&local_90,&local_a8);
      }
LAB_00111e3f:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8.reference_tokens);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (*local_d0._M_dataplus._M_p == '\x02') {
        local_d0.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_d0._M_dataplus._M_p == '\x01') {
        local_d0._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_d0._M_string_length);
      }
      else {
        local_d0.field_2._8_8_ = local_d0.field_2._8_8_ + 1;
      }
      bVar3 = detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_d0,&local_50);
    } while (!bVar3);
  }
  return;
}

Assistant:

void patch_inplace(const basic_json& json_patch)
    {
        basic_json& result = *this;
        // the valid JSON Patch operations
        enum class patch_operations {add, remove, replace, move, copy, test, invalid};

        const auto get_op = [](const std::string & op)
        {
            if (op == "add")
            {
                return patch_operations::add;
            }
            if (op == "remove")
            {
                return patch_operations::remove;
            }
            if (op == "replace")
            {
                return patch_operations::replace;
            }
            if (op == "move")
            {
                return patch_operations::move;
            }
            if (op == "copy")
            {
                return patch_operations::copy;
            }
            if (op == "test")
            {
                return patch_operations::test;
            }

            return patch_operations::invalid;
        };

        // wrapper for "add" operation; add value at ptr
        const auto operation_add = [&result](json_pointer & ptr, basic_json val)
        {
            // adding to the root of the target document means replacing it
            if (ptr.empty())
            {
                result = val;
                return;
            }

            // make sure the top element of the pointer exists
            json_pointer top_pointer = ptr.top();
            if (top_pointer != ptr)
            {
                result.at(top_pointer);
            }

            // get reference to parent of JSON pointer ptr
            const auto last_path = ptr.back();
            ptr.pop_back();
            // parent must exist when performing patch add per RFC6902 specs
            basic_json& parent = result.at(ptr);

            switch (parent.m_type)
            {
                case value_t::null:
                case value_t::object:
                {
                    // use operator[] to add value
                    parent[last_path] = val;
                    break;
                }

                case value_t::array:
                {
                    if (last_path == "-")
                    {
                        // special case: append to back
                        parent.push_back(val);
                    }
                    else
                    {
                        const auto idx = json_pointer::template array_index<basic_json_t>(last_path);
                        if (JSON_HEDLEY_UNLIKELY(idx > parent.size()))
                        {
                            // avoid undefined behavior
                            JSON_THROW(out_of_range::create(401, detail::concat("array index ", std::to_string(idx), " is out of range"), &parent));
                        }

                        // default case: insert add offset
                        parent.insert(parent.begin() + static_cast<difference_type>(idx), val);
                    }
                    break;
                }

                // if there exists a parent it cannot be primitive
                case value_t::string: // LCOV_EXCL_LINE
                case value_t::boolean: // LCOV_EXCL_LINE
                case value_t::number_integer: // LCOV_EXCL_LINE
                case value_t::number_unsigned: // LCOV_EXCL_LINE
                case value_t::number_float: // LCOV_EXCL_LINE
                case value_t::binary: // LCOV_EXCL_LINE
                case value_t::discarded: // LCOV_EXCL_LINE
                default:            // LCOV_EXCL_LINE
                    JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
            }
        };

        // wrapper for "remove" operation; remove value at ptr
        const auto operation_remove = [this, &result](json_pointer & ptr)
        {
            // get reference to parent of JSON pointer ptr
            const auto last_path = ptr.back();
            ptr.pop_back();
            basic_json& parent = result.at(ptr);

            // remove child
            if (parent.is_object())
            {
                // perform range check
                auto it = parent.find(last_path);
                if (JSON_HEDLEY_LIKELY(it != parent.end()))
                {
                    parent.erase(it);
                }
                else
                {
                    JSON_THROW(out_of_range::create(403, detail::concat("key '", last_path, "' not found"), this));
                }
            }
            else if (parent.is_array())
            {
                // note erase performs range check
                parent.erase(json_pointer::template array_index<basic_json_t>(last_path));
            }
        };

        // type check: top level value must be an array
        if (JSON_HEDLEY_UNLIKELY(!json_patch.is_array()))
        {
            JSON_THROW(parse_error::create(104, 0, "JSON patch must be an array of objects", &json_patch));
        }

        // iterate and apply the operations
        for (const auto& val : json_patch)
        {
            // wrapper to get a value for an operation
            const auto get_value = [&val](const std::string & op,
                                          const std::string & member,
                                          bool string_type) -> basic_json &
            {
                // find value
                auto it = val.m_value.object->find(member);

                // context-sensitive error message
                const auto error_msg = (op == "op") ? "operation" : detail::concat("operation '", op, '\'');

                // check if desired value is present
                if (JSON_HEDLEY_UNLIKELY(it == val.m_value.object->end()))
                {
                    // NOLINTNEXTLINE(performance-inefficient-string-concatenation)
                    JSON_THROW(parse_error::create(105, 0, detail::concat(error_msg, " must have member '", member, "'"), &val));
                }

                // check if result is of type string
                if (JSON_HEDLEY_UNLIKELY(string_type && !it->second.is_string()))
                {
                    // NOLINTNEXTLINE(performance-inefficient-string-concatenation)
                    JSON_THROW(parse_error::create(105, 0, detail::concat(error_msg, " must have string member '", member, "'"), &val));
                }

                // no error: return value
                return it->second;
            };

            // type check: every element of the array must be an object
            if (JSON_HEDLEY_UNLIKELY(!val.is_object()))
            {
                JSON_THROW(parse_error::create(104, 0, "JSON patch must be an array of objects", &val));
            }

            // collect mandatory members
            const auto op = get_value("op", "op", true).template get<std::string>();
            const auto path = get_value(op, "path", true).template get<std::string>();
            json_pointer ptr(path);

            switch (get_op(op))
            {
                case patch_operations::add:
                {
                    operation_add(ptr, get_value("add", "value", false));
                    break;
                }

                case patch_operations::remove:
                {
                    operation_remove(ptr);
                    break;
                }

                case patch_operations::replace:
                {
                    // the "path" location must exist - use at()
                    result.at(ptr) = get_value("replace", "value", false);
                    break;
                }

                case patch_operations::move:
                {
                    const auto from_path = get_value("move", "from", true).template get<std::string>();
                    json_pointer from_ptr(from_path);

                    // the "from" location must exist - use at()
                    basic_json v = result.at(from_ptr);

                    // The move operation is functionally identical to a
                    // "remove" operation on the "from" location, followed
                    // immediately by an "add" operation at the target
                    // location with the value that was just removed.
                    operation_remove(from_ptr);
                    operation_add(ptr, v);
                    break;
                }

                case patch_operations::copy:
                {
                    const auto from_path = get_value("copy", "from", true).template get<std::string>();
                    const json_pointer from_ptr(from_path);

                    // the "from" location must exist - use at()
                    basic_json v = result.at(from_ptr);

                    // The copy is functionally identical to an "add"
                    // operation at the target location using the value
                    // specified in the "from" member.
                    operation_add(ptr, v);
                    break;
                }

                case patch_operations::test:
                {
                    bool success = false;
                    JSON_TRY
                    {
                        // check if "value" matches the one at "path"
                        // the "path" location must exist - use at()
                        success = (result.at(ptr) == get_value("test", "value", false));
                    }
                    JSON_INTERNAL_CATCH (out_of_range&)
                    {
                        // ignore out of range errors: success remains false
                    }

                    // throw an exception if test fails
                    if (JSON_HEDLEY_UNLIKELY(!success))
                    {
                        JSON_THROW(other_error::create(501, detail::concat("unsuccessful: ", val.dump()), &val));
                    }

                    break;
                }

                case patch_operations::invalid:
                default:
                {
                    // op must be "add", "remove", "replace", "move", "copy", or
                    // "test"
                    JSON_THROW(parse_error::create(105, 0, detail::concat("operation value '", op, "' is invalid"), &val));
                }
            }
        }